

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_function-c.cpp
# Opt level: O3

duckdb_state
duckdb_register_aggregate_function(duckdb_connection connection,duckdb_aggregate_function function)

{
  vector<duckdb::AggregateFunction,_true> *this;
  duckdb_state dVar1;
  long lVar2;
  duckdb_aggregate_function p_Var3;
  aggregate_size_t *pp_Var4;
  byte bVar5;
  AggregateFunctionSet set;
  string local_1b0;
  AggregateFunctionSet local_190;
  AggregateFunction local_158;
  
  bVar5 = 0;
  dVar1 = DuckDBError;
  if (function != (duckdb_aggregate_function)0x0 && connection != (duckdb_connection)0x0) {
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b0,*(long *)(function + 8),
               *(long *)(function + 0x10) + *(long *)(function + 8));
    duckdb::AggregateFunctionSet::AggregateFunctionSet(&local_190,&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p);
    }
    duckdb::SimpleFunction::SimpleFunction((SimpleFunction *)&local_158,(SimpleFunction *)function);
    local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)&PTR__BaseScalarFunction_02439fe0;
    duckdb::LogicalType::LogicalType
              (&local_158.super_BaseScalarFunction.return_type,(LogicalType *)(function + 0x90));
    local_158.super_BaseScalarFunction._168_4_ = *(undefined4 *)(function + 0xa8);
    local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)&PTR__AggregateFunction_0243cea8;
    p_Var3 = function + 0xb0;
    pp_Var4 = &local_158.state_size;
    for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
      *pp_Var4 = *(aggregate_size_t *)p_Var3;
      p_Var3 = p_Var3 + (ulong)bVar5 * -0x10 + 8;
      pp_Var4 = pp_Var4 + (ulong)bVar5 * -2 + 1;
    }
    local_158._280_2_ = *(undefined2 *)(function + 0x118);
    local_158.function_info.internal.
    super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)(function + 0x120);
    local_158.function_info.internal.
    super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(function + 0x128);
    if (local_158.function_info.internal.
        super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_158.function_info.internal.
         super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_158.function_info.internal.
              super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_158.function_info.internal.
         super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_158.function_info.internal.
              super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    this = &local_190.super_FunctionSet<duckdb::AggregateFunction>.functions;
    std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
    emplace_back<duckdb::AggregateFunction>
              (&this->
                super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
               &local_158);
    local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)&PTR__AggregateFunction_0243cea8;
    if (local_158.function_info.internal.
        super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_158.function_info.internal.
                 super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    duckdb::BaseScalarFunction::~BaseScalarFunction(&local_158.super_BaseScalarFunction);
    dVar1 = duckdb_register_aggregate_function_set
                      (connection,(duckdb_aggregate_function_set)&local_190);
    std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::~vector
              (&this->
                super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190.super_FunctionSet<duckdb::AggregateFunction>.name._M_dataplus._M_p !=
        &local_190.super_FunctionSet<duckdb::AggregateFunction>.name.field_2) {
      operator_delete(local_190.super_FunctionSet<duckdb::AggregateFunction>.name._M_dataplus._M_p);
    }
  }
  return dVar1;
}

Assistant:

duckdb_state duckdb_register_aggregate_function(duckdb_connection connection, duckdb_aggregate_function function) {
	if (!connection || !function) {
		return DuckDBError;
	}

	auto &aggregate_function = GetCAggregateFunction(function);
	duckdb::AggregateFunctionSet set(aggregate_function.name);
	set.AddFunction(aggregate_function);
	return duckdb_register_aggregate_function_set(connection, reinterpret_cast<duckdb_aggregate_function_set>(&set));
}